

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementBackgroundBorder.cpp
# Opt level: O2

void __thiscall Rml::ElementBackgroundBorder::Render(ElementBackgroundBorder *this,Element *element)

{
  Vector2f VVar1;
  _Base_ptr p_Var2;
  Background *pBVar3;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  Texture texture;
  UniqueRenderResource<Rml::CompiledShader,_unsigned_long,_0UL> local_78;
  undefined1 local_68 [16];
  Mesh local_58;
  
  if ((this->background_dirty != false) || (this->border_dirty == true)) {
    for (p_Var2 = (this->backgrounds)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 != &(this->backgrounds)._M_t._M_impl.super__Rb_tree_header;
        p_Var2 = (_Base_ptr)::std::_Rb_tree_increment(p_Var2)) {
      if (p_Var2[1]._M_color != _S_red) {
        Geometry::Release(&local_58,(Geometry *)&p_Var2[1]._M_parent,ReturnMesh);
        Mesh::~Mesh(&local_58);
      }
    }
    GenerateGeometry(this,element);
    this->background_dirty = false;
    this->border_dirty = false;
  }
  pBVar3 = GetBackground(this,BoxShadow);
  if ((pBVar3 == (Background *)0x0) ||
     ((pBVar3->geometry).
      super_UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
      .resource_handle == Invalid)) {
    pBVar3 = GetBackground(this,BackgroundBorder);
    if (pBVar3 == (Background *)0x0) {
      return;
    }
    VVar1 = Element::GetAbsoluteOffset(element,Border);
    local_78.render_manager = (RenderManager *)0x0;
    local_78.resource_handle = 0;
    Geometry::Render(&pBVar3->geometry,VVar1,(Texture)(ZEXT816(0xffffffffffffffff) << 0x40),
                     (CompiledShader *)&local_78);
  }
  else {
    VVar1 = Element::GetAbsoluteOffset(element,Border);
    local_68._8_4_ = extraout_XMM0_Dc;
    local_68._0_4_ = VVar1.x;
    local_68._4_4_ = VVar1.y;
    local_68._12_4_ = extraout_XMM0_Dd;
    texture = CallbackTexture::operator_cast_to_Texture(&pBVar3->texture);
    local_78.render_manager = (RenderManager *)0x0;
    local_78.resource_handle = 0;
    Geometry::Render(&pBVar3->geometry,(Vector2f)local_68._0_8_,texture,(CompiledShader *)&local_78)
    ;
  }
  UniqueRenderResource<Rml::CompiledShader,_unsigned_long,_0UL>::~UniqueRenderResource(&local_78);
  return;
}

Assistant:

void ElementBackgroundBorder::Render(Element* element)
{
	if (background_dirty || border_dirty)
	{
		for (auto& background : backgrounds)
		{
			if (background.first != BackgroundType::BackgroundBorder)
				background.second.geometry.Release();
		}

		GenerateGeometry(element);

		background_dirty = false;
		border_dirty = false;
	}

	Background* shadow = GetBackground(BackgroundType::BoxShadow);
	if (shadow && shadow->geometry)
		shadow->geometry.Render(element->GetAbsoluteOffset(BoxArea::Border), shadow->texture);
	else if (Background* background = GetBackground(BackgroundType::BackgroundBorder))
	{
		auto offset = element->GetAbsoluteOffset(BoxArea::Border);
		background->geometry.Render(offset);
	}
}